

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseTimeCoordinator.cpp
# Opt level: O2

vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> * __thiscall
helics::BaseTimeCoordinator::getDependencies
          (vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
           *__return_storage_ptr__,BaseTimeCoordinator *this)

{
  pointer pDVar1;
  DependencyInfo *dep;
  pointer pDVar2;
  
  (__return_storage_ptr__->
  super__Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pDVar1 = (this->dependencies).dependencies.
           super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pDVar2 = (this->dependencies).dependencies.
                super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
                _M_impl.super__Vector_impl_data._M_start; pDVar2 != pDVar1; pDVar2 = pDVar2 + 1) {
    if (pDVar2->dependency == true) {
      std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>::push_back
                (__return_storage_ptr__,&pDVar2->fedID);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<GlobalFederateId> BaseTimeCoordinator::getDependencies() const
{
    std::vector<GlobalFederateId> deps;
    for (const auto& dep : dependencies) {
        if (dep.dependency) {
            deps.push_back(dep.fedID);
        }
    }
    return deps;
}